

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void add_sampler(Context *ctx,int regnum,TextureType ttype,int texbem)

{
  RegisterList *pRVar1;
  uint local_2c;
  uint i;
  RegisterList *item;
  RegisterType rtype;
  int texbem_local;
  TextureType ttype_local;
  int regnum_local;
  Context *ctx_local;
  
  pRVar1 = reglist_insert(ctx,&ctx->samplers,REG_TYPE_SAMPLER,regnum);
  rtype = ttype;
  if (ctx->samplermap != (MOJOSHADER_samplerMap *)0x0) {
    for (local_2c = 0; local_2c < ctx->samplermap_count; local_2c = local_2c + 1) {
      if (ctx->samplermap[local_2c].index == regnum) {
        rtype = cvtMojoToD3DSamplerType(ctx->samplermap[local_2c].type);
        break;
      }
    }
  }
  pRVar1->index = rtype;
  pRVar1->misc = texbem | pRVar1->misc;
  return;
}

Assistant:

static inline void add_sampler(Context *ctx, const int regnum,
                               TextureType ttype, const int texbem)
{
    const RegisterType rtype = REG_TYPE_SAMPLER;

    // !!! FIXME: make sure it doesn't exist?
    // !!! FIXME:  (ps_1_1 assume we can add it multiple times...)
    RegisterList *item = reglist_insert(ctx, &ctx->samplers, rtype, regnum);

    if (ctx->samplermap != NULL)
    {
        unsigned int i;
        for (i = 0; i < ctx->samplermap_count; i++)
        {
            if (ctx->samplermap[i].index == regnum)
            {
                ttype = cvtMojoToD3DSamplerType(ctx->samplermap[i].type);
                break;
            } // if
        } // for
    } // if

    item->index = (int) ttype;
    item->misc |= texbem;
}